

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O0

void __thiscall
TestOutput::printVisualStudioErrorInFileOnLine
          (TestOutput *this,SimpleString *file,size_t lineNumber)

{
  char *pcVar1;
  undefined8 in_RDX;
  long *in_RDI;
  
  (**(code **)(*in_RDI + 0x58))(in_RDI,"\n");
  pcVar1 = SimpleString::asCharString((SimpleString *)0x11d027);
  (**(code **)(*in_RDI + 0x58))(in_RDI,pcVar1);
  (**(code **)(*in_RDI + 0x58))(in_RDI,"(");
  (**(code **)(*in_RDI + 0x68))(in_RDI,in_RDX);
  (**(code **)(*in_RDI + 0x58))(in_RDI,"):");
  (**(code **)(*in_RDI + 0x58))(in_RDI," error:");
  return;
}

Assistant:

void TestOutput::printVisualStudioErrorInFileOnLine(SimpleString file, size_t lineNumber)
{
    print("\n");
    print(file.asCharString());
    print("(");
    print(lineNumber);
    print("):");
    print(" error:");
}